

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetUnsizedArrayTypeName(ExpressionContext *ctx,TypeBase *type)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  char *pos;
  char *name;
  uint nameLength;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  char *__s;
  
  uVar1 = InplaceStr::length(&type->name);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 3));
  __s = (char *)CONCAT44(extraout_var,iVar2);
  pcVar4 = (type->name).begin;
  uVar3 = InplaceStr::length(&type->name);
  memcpy(__s,pcVar4,(ulong)uVar3);
  uVar3 = InplaceStr::length(&type->name);
  pcVar4 = __s + uVar3;
  pcVar4[0] = '[';
  pcVar4[1] = ']';
  pcVar4[2] = '\0';
  sVar5 = strlen(__s);
  if (sVar5 + 1 == (ulong)(uVar1 + 3)) {
    InplaceStr::InplaceStr((InplaceStr *)&ctx_local,__s);
    return _ctx_local;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0xb4,"InplaceStr GetUnsizedArrayTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetUnsizedArrayTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned nameLength = type->name.length() + unsigned(strlen("[]")) + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, type->name.begin, type->name.length());
	pos += type->name.length();

	memcpy(pos, "[]", 2);
	pos += 2;

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}